

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int cfftmi_(int *n,double *wsave,int *lensav,int *ier)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  *ier = 0;
  iVar1 = *lensav;
  iVar2 = *n;
  dVar3 = log((double)iVar2);
  if (iVar1 < (int)(dVar3 / 0.6931471805599453) + iVar2 * 2 + 4) {
    *ier = 2;
  }
  iVar1 = *n;
  if ((long)iVar1 != 1) {
    mcfti1_(n,wsave,wsave + (long)iVar1 * 2,wsave + (long)(iVar1 * 2) + 1);
  }
  return 0;
}

Assistant:

int cfftmi_(int *n, fft_real_t *wsave, int *lensav,
	int *ier)
{
    /* Builtin functions */


    /* Local variables */
     int iw1;
    extern /* Subroutine */ int mcfti1_(int *, fft_real_t *, fft_real_t *, fft_real_t *),
	    xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --wsave;

    /* Function Body */
    *ier = 0;

    if (*lensav < (*n << 1) + (int) (log((fft_real_t) (*n)) / log(2.0)) + 4) {
	*ier = 2;
	//xerfft_("CFFTMI ", &c__3, (ftnlen)7);
    }

    if (*n == 1) {
	return 0;
    }

    iw1 = *n + *n + 1;
    mcfti1_(n, &wsave[1], &wsave[iw1], &wsave[iw1 + 1]);
    return 0;
}